

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  IndexValue *p;
  int *__dest;
  IndexValue *__dest_00;
  int *__src;
  int __n2;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  _Var1;
  new_allocator<int> local_32;
  new_allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> local_31;
  
  DebugCheckInvariants(this);
  _Var1._M_head_impl.len_ = (Deleter)0;
  if ((this->dense_).ptr_._M_t.
      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
      .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>._M_head_impl
      != (IndexValue *)0x0) {
    _Var1._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  if ((int)_Var1._M_head_impl.len_ < new_max_size) {
    __dest = __gnu_cxx::new_allocator<int>::allocate(&local_32,(long)new_max_size,(void *)0x0);
    __dest_00 = __gnu_cxx::new_allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::allocate
                          (&local_31,(long)new_max_size,(void *)0x0);
    __src = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if (0 < (int)_Var1._M_head_impl.len_) {
      memmove(__dest,__src,(ulong)(uint)_Var1._M_head_impl.len_ * 4);
      memmove(__dest_00,
              (this->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl,(ulong)(uint)_Var1._M_head_impl.len_ << 4);
      __src = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
              .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
    }
    (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = __dest;
    if (__src != (int *)0x0) {
      operator_delete(__src,(long)(int)(this->sparse_).ptr_._M_t.
                                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                       super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> <<
                            2);
    }
    (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> =
         (_Head_base<1UL,_re2::PODArray<int>::Deleter,_false>)new_max_size;
    p = (this->dense_).ptr_._M_t.
        super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
        .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
        _M_head_impl;
    (this->dense_).ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>._M_head_impl =
         __dest_00;
    if (p != (IndexValue *)0x0) {
      operator_delete(p,(long)(int)(this->dense_).ptr_._M_t.
                                   super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                                   .
                                   super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                                   .
                                   super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
                        << 4);
    }
    (this->dense_).ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    .
    super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    .
    super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
         = (_Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
            )new_max_size;
  }
  if (new_max_size < this->size_) {
    this->size_ = new_max_size;
  }
  DebugCheckInvariants(this);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}